

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokParamsStd(bign_params *params,size_t privkey_len)

{
  err_t eVar1;
  
  switch(privkey_len << 0x3d | privkey_len - 0x18 >> 3) {
  case 0:
    eVar1 = bign96ParamsStd(params,"1.2.112.0.2.0.34.101.45.3.0");
    return eVar1;
  case 1:
    eVar1 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.1");
    return eVar1;
  default:
    return 0x6d;
  case 3:
    eVar1 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.2");
    return eVar1;
  case 5:
    eVar1 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.3");
    return eVar1;
  }
}

Assistant:

static err_t btokParamsStd(bign_params* params, size_t privkey_len)
{
	switch (privkey_len)
	{
	case 24:
		return bign96ParamsStd(params, "1.2.112.0.2.0.34.101.45.3.0");
	case 32:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1");
	case 48:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.2");
	case 64:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.3");
	}
	return ERR_BAD_INPUT;
}